

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfa_extract.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _List *this;
  element_type *this_00;
  char cVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  undefined8 uVar5;
  ulong uVar6;
  int iVar7;
  pointer pPVar8;
  char *pcVar9;
  undefined1 local_b8 [8];
  path output_dir;
  undefined1 local_68 [8];
  string_view entry_data;
  shared_ptr<mg::fs::MappedFile> hfa_data;
  MappedHfa *local_38;
  unique_ptr<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>_> hfa;
  
  if (argc < 2) {
LAB_00103851:
    main_cold_3();
    return -1;
  }
  uVar6 = 1;
  pcVar9 = (char *)0x0;
  pcVar3 = (char *)0x0;
  do {
    if (pcVar3 == (char *)0x0) {
      pcVar3 = argv[uVar6];
    }
    else {
      if (pcVar9 != (char *)0x0) {
        main_cold_1();
        return -1;
      }
      pcVar9 = argv[uVar6];
    }
    uVar6 = uVar6 + 1;
  } while ((uint)argc != uVar6);
  if (pcVar3 == (char *)0x0) goto LAB_00103851;
  this = &output_dir._M_cmpts;
  mg::fs::MappedFile::open((char *)this,(int)pcVar3);
  std::__shared_ptr<mg::fs::MappedFile,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>,void>
            ((__shared_ptr<mg::fs::MappedFile,(__gnu_cxx::_Lock_policy)2> *)&entry_data._M_str,
             (unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)this);
  std::unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_>::~unique_ptr
            ((unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
             &output_dir._M_cmpts);
  this_00 = hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (entry_data._M_str != (char *)0x0) {
    hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)entry_data._M_str;
    if (hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->_size =
             (int)(hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_size + 1;
        UNLOCK();
      }
      else {
        *(int *)&(hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->_size =
             (int)(hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_size + 1;
      }
    }
    mg::data::MappedHfa::parse
              ((MappedHfa *)&local_38,
               (shared_ptr<mg::fs::MappedFile> *)
               &hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (this_00 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    if (local_38 != (MappedHfa *)0x0) {
      output_dir._32_8_ = ".";
      if (pcVar9 != (char *)0x0) {
        output_dir._32_8_ = pcVar9;
      }
      std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                ((path *)local_b8,(char **)&output_dir._M_cmpts,auto_format);
      cVar1 = std::filesystem::status((path *)local_b8);
      if (((cVar1 == -1) || (cVar1 == '\0')) &&
         (cVar1 = std::filesystem::create_directories((path *)local_b8), cVar1 == '\0')) {
        main_cold_2();
        iVar7 = -1;
      }
      else {
        if ((local_38->_entries).
            super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (local_38->_entries).
            super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar6 = 0;
          do {
            _local_68 = mg::data::MappedHfa::entry_data(local_38,(int)uVar6);
            std::filesystem::__cxx11::path::path((path *)this,(path *)local_b8);
            pPVar8 = (local_38->_entries).
                     super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(local_38->_entries).
                              super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar8 >> 7) <=
                (uVar6 & 0xffffffff)) {
              uVar5 = std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
              if (local_38 != (MappedHfa *)0x0) {
                std::default_delete<mg::data::MappedHfa>::operator()
                          ((default_delete<mg::data::MappedHfa> *)&local_38,local_38);
              }
              if (hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           hfa_data.
                           super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          );
              }
              _Unwind_Resume(uVar5);
            }
            pPVar8 = pPVar8 + (uVar6 & 0xffffffff);
            sVar4 = strlen(pPVar8->filename);
            std::filesystem::__cxx11::path::_M_append(this,sVar4,pPVar8);
            bVar2 = mg::fs::write_file((char *)output_dir._32_8_,(string_view *)local_68);
            if (bVar2) {
              fprintf(_stderr,"Wrote %lu bytes to %s\n",local_68,output_dir._32_8_);
            }
            std::filesystem::__cxx11::path::~path((path *)this);
            uVar6 = uVar6 + 1;
          } while (uVar6 < (ulong)((long)(local_38->_entries).
                                         super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(local_38->_entries).
                                         super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 7));
        }
        iVar7 = 0;
      }
      std::filesystem::__cxx11::path::~path((path *)local_b8);
      if (local_38 != (MappedHfa *)0x0) {
        std::default_delete<mg::data::MappedHfa>::operator()
                  ((default_delete<mg::data::MappedHfa> *)&local_38,local_38);
      }
      goto LAB_00103841;
    }
  }
  iVar7 = -1;
LAB_00103841:
  if (hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    return iVar7;
  }
  return iVar7;
}

Assistant:

int main(int argc, char **argv) {
  // Parse args
  const char *input_basename = nullptr;
  const char *output_path = nullptr;
  for (int i = 1; i < argc; i++) {
    // Basename?
    if (input_basename == nullptr) {
      input_basename = argv[i];
      continue;
    }

    // Output dir?
    if (output_path == nullptr) {
      output_path = argv[i];
      continue;
    }

    // Invalid state
    usage(argv[0]);
    return -1;
  }

  // Check args are OK
  if (input_basename == nullptr) {
    usage(argv[0]);
    return -1;
  }

  // Map the file
  std::shared_ptr<mg::fs::MappedFile> hfa_data =
      mg::fs::MappedFile::open(input_basename);
  if (hfa_data == nullptr) {
    return -1;
  }

  // Parse the data
  auto hfa = mg::data::MappedHfa::parse(hfa_data);
  if (hfa == nullptr) {
    return -1;
  }

  // Ensure output dir exists
  std::filesystem::path output_dir = output_path ? output_path : ".";
  if (!std::filesystem::exists(output_dir) &&
      !std::filesystem::create_directories(output_dir)) {
    fprintf(stderr, "Failed to create output path '%s'\n", output_dir.c_str());
    return -1;
  }

  // Utility method to write an index to an output file
  auto write_entry = [&](unsigned index) -> int {
    auto entry_data = hfa->entry_data(index);
    std::filesystem::path output_path = output_dir;
    output_path.append(hfa->entries().at(index).filename);
    if (!mg::fs::write_file(output_path.c_str(), entry_data)) {
      return -1;
    }
    fprintf(stderr, "Wrote %lu bytes to %s\n", entry_data.size(),
            output_path.c_str());

    return 0;
  };

  // Iterate the mrg entries and emit
  for (std::vector<std::string>::size_type i = 0; i < hfa->entries().size();
       i++) {
    write_entry(i);
  }

  return 0;
}